

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
char_spec_handler::on_int(char_spec_handler *this)

{
  ulong uVar1;
  wchar_t value;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
  *this_00;
  basic_buffer<wchar_t> *pbVar2;
  size_t sVar3;
  
  this_00 = this->formatter;
  value = this->value;
  if (this_00->specs_ != (basic_format_specs<wchar_t> *)0x0) {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
    write_int<wchar_t,fmt::v5::basic_format_specs<wchar_t>>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *
               )this_00,value,this_00->specs_);
    return;
  }
  pbVar2 = (this_00->writer_).out_.container;
  sVar3 = pbVar2->size_;
  uVar1 = sVar3 + 1;
  if (pbVar2->capacity_ < uVar1) {
    (**pbVar2->_vptr_basic_buffer)(pbVar2,uVar1);
  }
  pbVar2->size_ = uVar1;
  pbVar2->ptr_[sVar3] = value;
  return;
}

Assistant:

void on_int() {
      if (formatter.specs_)
        formatter.writer_.write_int(value, *formatter.specs_);
      else
        formatter.writer_.write(value);
    }